

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::ComputeTestInstance::iterate
          (TestStatus *__return_storage_ptr__,ComputeTestInstance *this)

{
  ProgramCollection<vk::ProgramBinary> *this_00;
  bool bVar1;
  deUint32 queueFamilyIndex;
  VkResult result;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  DescriptorSetLayoutBuilder *this_01;
  DescriptorPoolBuilder *this_02;
  DescriptorSetUpdateBuilder *this_03;
  ProgramBinary *binary;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  *expectedValues;
  VkSpecializationInfo *specInfo;
  allocator<char> local_229;
  VkBufferMemoryBarrier shaderWriteBarrier;
  RefBase<vk::VkCommandBuffer_s_*> local_1e8;
  string local_1c8;
  VkQueue local_1a0;
  Specialization specialization;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_148;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_128;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_108;
  VkDescriptorBufferInfo descriptorBufferInfo;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_c8;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_a8;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_88;
  Buffer resultBuffer;
  
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_1a0 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  makeBufferCreateInfo((VkBufferCreateInfo *)&specialization,this->m_ssboSize,0x20);
  pipeline::Buffer::Buffer
            (&resultBuffer,vk,device,allocator,(VkBufferCreateInfo *)&specialization,
             (MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&specialization);
  this_01 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)&specialization,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&shaderWriteBarrier,this_01,vk,device,0);
  local_108.m_data.deleter.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  local_108.m_data.deleter.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_108.m_data.object.m_internal = shaderWriteBarrier._0_8_;
  local_108.m_data.deleter.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderWriteBarrier._4_4_ = 0;
  shaderWriteBarrier.pNext = (void *)0x0;
  shaderWriteBarrier.srcAccessMask = 0;
  shaderWriteBarrier.dstAccessMask = 0;
  shaderWriteBarrier.srcQueueFamilyIndex = 0;
  shaderWriteBarrier.dstQueueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&shaderWriteBarrier);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&specialization);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&shaderWriteBarrier);
  this_02 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&shaderWriteBarrier,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&specialization,this_02,vk,device,1,1);
  local_88.m_data.deleter.m_device =
       (VkDevice)
       specialization.m_data.
       super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       specialization.m_entries.
       super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_88.m_data.object.m_internal =
       (deUint64)
       specialization.m_data.
       super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_88.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       specialization.m_data.
       super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  specialization.m_data.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  specialization.m_data.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  specialization.m_data.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  specialization.m_entries.
  super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&specialization);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&shaderWriteBarrier);
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&specialization,vk,device,
                    (VkDescriptorPool)local_88.m_data.object.m_internal,
                    (VkDescriptorSetLayout)local_108.m_data.object.m_internal);
  local_128.m_data.deleter.m_device =
       (VkDevice)
       specialization.m_data.
       super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_128.m_data.deleter.m_pool.m_internal =
       (deUint64)
       specialization.m_entries.
       super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_128.m_data.object.m_internal =
       (deUint64)
       specialization.m_data.
       super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_128.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       specialization.m_data.
       super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  specialization.m_data.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  specialization.m_data.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  specialization.m_data.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  specialization.m_entries.
  super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&specialization);
  descriptorBufferInfo.range = this->m_ssboSize;
  descriptorBufferInfo.buffer.m_internal =
       resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  descriptorBufferInfo.offset = 0;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&specialization);
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderWriteBarrier._4_4_ = 0;
  this_03 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      ((DescriptorSetUpdateBuilder *)&specialization,
                       (VkDescriptorSet)local_128.m_data.object.m_internal,
                       (Location *)&shaderWriteBarrier,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       &descriptorBufferInfo);
  ::vk::DescriptorSetUpdateBuilder::update(this_03,vk,device);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&specialization);
  Specialization::Specialization(&specialization,&this->m_specConstants);
  specInfo = (VkSpecializationInfo *)0x0;
  if (specialization.m_entries.
      super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      specialization.m_entries.
      super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    specInfo = &specialization.m_specialization;
  }
  this_00 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"comp",(allocator<char> *)&local_148);
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_00,&local_1c8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&shaderWriteBarrier,vk,device,binary,0);
  local_a8.m_data.deleter.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  local_a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_a8.m_data.object.m_internal = shaderWriteBarrier._0_8_;
  local_a8.m_data.deleter.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderWriteBarrier._4_4_ = 0;
  shaderWriteBarrier.pNext = (void *)0x0;
  shaderWriteBarrier.srcAccessMask = 0;
  shaderWriteBarrier.dstAccessMask = 0;
  shaderWriteBarrier.srcQueueFamilyIndex = 0;
  shaderWriteBarrier.dstQueueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&shaderWriteBarrier);
  std::__cxx11::string::~string((string *)&local_1c8);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&shaderWriteBarrier,vk,device,
                     (VkDescriptorSetLayout)local_108.m_data.object.m_internal);
  local_1c8.field_2._M_allocated_capacity._0_4_ = shaderWriteBarrier.srcAccessMask;
  local_1c8.field_2._M_allocated_capacity._4_4_ = shaderWriteBarrier.dstAccessMask;
  local_1c8.field_2._8_4_ = shaderWriteBarrier.srcQueueFamilyIndex;
  local_1c8.field_2._12_4_ = shaderWriteBarrier.dstQueueFamilyIndex;
  local_1c8._M_dataplus._M_p = (pointer)shaderWriteBarrier._0_8_;
  local_1c8._M_string_length = (size_type)shaderWriteBarrier.pNext;
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderWriteBarrier._4_4_ = 0;
  shaderWriteBarrier.pNext = (void *)0x0;
  shaderWriteBarrier.srcAccessMask = 0;
  shaderWriteBarrier.dstAccessMask = 0;
  shaderWriteBarrier.srcQueueFamilyIndex = 0;
  shaderWriteBarrier.dstQueueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&shaderWriteBarrier);
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&shaderWriteBarrier,vk,device,
                      (VkPipelineLayout)local_1c8._M_dataplus._M_p,
                      (VkShaderModule)local_a8.m_data.object.m_internal,specInfo);
  local_148.m_data.deleter.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  local_148.m_data.deleter.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_148.m_data.object.m_internal = shaderWriteBarrier._0_8_;
  local_148.m_data.deleter.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderWriteBarrier._4_4_ = 0;
  shaderWriteBarrier.pNext = (void *)0x0;
  shaderWriteBarrier.srcAccessMask = 0;
  shaderWriteBarrier.dstAccessMask = 0;
  shaderWriteBarrier.srcQueueFamilyIndex = 0;
  shaderWriteBarrier.dstQueueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&shaderWriteBarrier);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&shaderWriteBarrier,vk,device,2,
             queueFamilyIndex,(VkAllocationCallbacks *)0x0);
  local_c8.m_data.deleter.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  local_c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_c8.m_data.object.m_internal = shaderWriteBarrier._0_8_;
  local_c8.m_data.deleter.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderWriteBarrier._4_4_ = 0;
  shaderWriteBarrier.pNext = (void *)0x0;
  shaderWriteBarrier.srcAccessMask = 0;
  shaderWriteBarrier.dstAccessMask = 0;
  shaderWriteBarrier.srcQueueFamilyIndex = 0;
  shaderWriteBarrier.dstQueueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&shaderWriteBarrier);
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&shaderWriteBarrier,vk,device,
                    (VkCommandPool)local_c8.m_data.object.m_internal);
  local_1e8.m_data.deleter.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  local_1e8.m_data.deleter.m_pool.m_internal._0_4_ = shaderWriteBarrier.srcQueueFamilyIndex;
  local_1e8.m_data.deleter.m_pool.m_internal._4_4_ = shaderWriteBarrier.dstQueueFamilyIndex;
  local_1e8.m_data.object = (VkCommandBuffer_s *)shaderWriteBarrier._0_8_;
  local_1e8.m_data.deleter.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderWriteBarrier._4_4_ = 0;
  shaderWriteBarrier.pNext = (void *)0x0;
  shaderWriteBarrier.srcAccessMask = 0;
  shaderWriteBarrier.dstAccessMask = 0;
  shaderWriteBarrier.srcQueueFamilyIndex = 0;
  shaderWriteBarrier.dstQueueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&shaderWriteBarrier);
  beginCommandBuffer(vk,local_1e8.m_data.object);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,local_1e8.m_data.object,1,local_148.m_data.object.m_internal);
  (*vk->_vptr_DeviceInterface[0x56])
            (vk,local_1e8.m_data.object,1,local_1c8._M_dataplus._M_p,0,1,&local_128,0,0);
  (*vk->_vptr_DeviceInterface[0x5d])(vk,local_1e8.m_data.object,1);
  makeBufferMemoryBarrier
            (&shaderWriteBarrier,0x40,0x2000,
             (VkBuffer)
             resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,this->m_ssboSize);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_1e8.m_data.object,0x800,0x4000,0,0,0,1,&shaderWriteBarrier,0,0);
  result = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_1e8.m_data.object);
  ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineSpecConstantTests.cpp"
                    ,0x207);
  submitCommandsAndWait(vk,device,local_1a0,local_1e8.m_data.object);
  expectedValues =
       (vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
        *)(resultBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
          m_offset;
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,(VkDeviceSize)expectedValues,this->m_ssboSize);
  bVar1 = verifyValues((anon_unknown_0 *)((this->super_TestInstance).m_context)->m_testCtx->m_log,
                       (TestLog *)
                       (resultBuffer.m_allocation.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                       .ptr)->m_hostPtr,&this->m_expectedValues,expectedValues);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shaderWriteBarrier,"Success",&local_229);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&shaderWriteBarrier);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shaderWriteBarrier,"Values did not match",&local_229);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&shaderWriteBarrier);
  }
  std::__cxx11::string::~string((string *)&shaderWriteBarrier);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_1e8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_c8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_148);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&local_1c8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_a8);
  Specialization::~Specialization(&specialization);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_128);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_88);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_108);
  pipeline::Buffer::~Buffer(&resultBuffer);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus ComputeTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Descriptors

	const Buffer resultBuffer(vk, device, allocator, makeBufferCreateInfo(m_ssboSize, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet        (makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  descriptorBufferInfo = makeDescriptorBufferInfo(resultBuffer.get(), 0ull, m_ssboSize);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &descriptorBufferInfo)
		.update(vk, device);

	// Specialization

	const Specialization        specialization (m_specConstants);
	const VkSpecializationInfo* pSpecInfo      = specialization.getSpecializationInfo();

	// Pipeline

	const Unique<VkShaderModule>   shaderModule  (createShaderModule (vk, device, m_context.getBinaryCollection().get("comp"), 0));
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout (vk, device, *descriptorSetLayout));
	const Unique<VkPipeline>       pipeline      (makeComputePipeline(vk, device, *pipelineLayout, *shaderModule, pSpecInfo));
	const Unique<VkCommandPool>    cmdPool       (createCommandPool  (vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>  cmdBuffer     (makeCommandBuffer  (vk, device, *cmdPool));

	beginCommandBuffer(vk, *cmdBuffer);

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

	vk.cmdDispatch(*cmdBuffer, 1u, 1u, 1u);

	{
		const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, m_ssboSize);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
	}

	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Verify results

	const Allocation& resultAlloc = resultBuffer.getAllocation();
	invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), m_ssboSize);

	if (verifyValues(m_context.getTestContext().getLog(), resultAlloc.getHostPtr(), m_expectedValues))
		return tcu::TestStatus::pass("Success");
	else
		return tcu::TestStatus::fail("Values did not match");
}